

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

void * nullcGetGlobal(char *name)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint *puVar4;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar2 = nullcGetVariableData((uint *)0x0);
    if (pvVar2 == (void *)0x0) {
      return (void *)0x0;
    }
    if (name == (char *)0x0) {
      return (void *)0x0;
    }
    if (NULLC::linker == 0) {
      return (void *)0x0;
    }
    uVar1 = NULLC::GetStringHash(name);
    iVar3 = *(int *)(NULLC::linker + 0x23c);
    if (iVar3 != 0) {
      puVar4 = (uint *)(*(long *)(NULLC::linker + 0x230) + 0xc);
      do {
        if (puVar4[-2] == uVar1) {
          return (void *)((long)pvVar2 + (ulong)*puVar4);
        }
        puVar4 = puVar4 + 4;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      return (void *)0x0;
    }
  }
  return (void *)0x0;
}

Assistant:

void* nullcGetGlobal(const char* name)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !mem)
		return NULL;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
			return mem + linker->exVariables[i].offset;
	}
	return NULL;
}